

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O2

object_ptr __thiscall mjs::global_object_impl::to_object(global_object_impl *this,value *v)

{
  string *val;
  gc_heap_ptr_untyped *p;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar1;
  native_error_exception *this_00;
  wostream *pwVar2;
  value *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar3;
  double val_00;
  object_ptr oVar4;
  wstring local_200;
  wstring_view local_1e0;
  wstring_view local_1d0 [2];
  wstring_view local_1b0;
  wostringstream woss;
  
  switch(in_RDX->type_) {
  case undefined:
  case null:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    pwVar2 = std::operator<<((wostream *)&woss,"Cannot convert ");
    pbVar1 = mjs::operator<<(pwVar2,in_RDX->type_);
    std::operator<<(pbVar1," to object");
    this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
    global_object::stack_trace_abi_cxx11_(&local_200,(global_object *)v);
    local_1e0._M_len = local_200._M_string_length;
    local_1e0._M_str = local_200._M_dataplus._M_p;
    std::__cxx11::wstringbuf::str();
    local_1b0._M_len = (size_t)local_1d0[0]._M_str;
    local_1b0._M_str = (wchar_t *)local_1d0[0]._M_len;
    native_error_exception::native_error_exception(this_00,type,&local_1e0,&local_1b0);
    __cxa_throw(this_00,&native_error_exception::typeinfo,
                native_error_exception::~native_error_exception);
  case boolean:
    gc_heap_ptr_untracked<mjs::object,_true>::track
              ((gc_heap_ptr_untracked<mjs::object,_true> *)&woss,
               (gc_heap *)
               ((long)&v[3].field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.
                       heap_ + 4));
    value::boolean_value(in_RDX);
    new_boolean((object_ptr *)this,SUB81(&woss,0));
    break;
  case number:
    gc_heap_ptr_untracked<mjs::object,_true>::track
              ((gc_heap_ptr_untracked<mjs::object,_true> *)&woss,
               (gc_heap *)
               &v[3].field_1.s_.super_gc_heap_ptr<mjs::gc_string>.super_gc_heap_ptr_untyped.pos_);
    val_00 = value::number_value(in_RDX);
    new_number((mjs *)this,(object_ptr *)&woss,val_00);
    break;
  case string:
    self_ptr((global_object_impl *)&woss);
    val = value::string_value(in_RDX);
    new_string((mjs *)this,(gc_heap_ptr<mjs::global_object> *)&woss,val);
    break;
  case object:
    p = &value::object_value(in_RDX)->super_gc_heap_ptr_untyped;
    gc_heap_ptr_untyped::gc_heap_ptr_untyped((gc_heap_ptr_untyped *)this,p);
    uVar3 = extraout_RDX;
    goto LAB_0013edf0;
  default:
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&woss);
    pwVar2 = std::operator<<((wostream *)&woss,"Not implemented: ");
    mjs::operator<<(pwVar2,in_RDX->type_);
    std::__cxx11::wstringbuf::str();
    local_1d0[0]._M_len = local_200._M_string_length;
    local_1d0[0]._M_str = local_200._M_dataplus._M_p;
    throw_runtime_error(local_1d0,
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/global_object.cpp"
                        ,0x244);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)&woss);
  uVar3 = extraout_RDX_00;
LAB_0013edf0:
  oVar4.super_gc_heap_ptr_untyped._8_8_ = uVar3;
  oVar4.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar4.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr to_object(const value& v) override {
        switch (v.type()) {
            // undefined and null give runtime errors
        case value_type::undefined:
        case value_type::null:
            {
                std::wostringstream woss;
                woss << "Cannot convert " << v.type() << " to object";
                throw native_error_exception{native_error_type::type, stack_trace(), woss.str()};
            }
        case value_type::boolean: return new_boolean(boolean_prototype_.track(heap()), v.boolean_value());
        case value_type::number:  return new_number(number_prototype_.track(heap()), v.number_value());
        case value_type::string:  return new_string(self_ptr(), v.string_value());
        case value_type::object:  return v.object_value();
        default:
            NOT_IMPLEMENTED(v.type());
        }
    }